

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.hpp
# Opt level: O0

void __thiscall libtorrent::aux::session_logger::session_logger(session_logger *this)

{
  session_logger *this_local;
  
  this->_vptr_session_logger = (_func_int **)&PTR___cxa_pure_virtual_00b8fa00;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT session_logger
	{
#ifndef TORRENT_DISABLE_LOGGING
		virtual bool should_log() const = 0;
		virtual void session_log(char const* fmt, ...) const TORRENT_FORMAT(2,3) = 0;
#endif

#if TORRENT_USE_ASSERTS
		virtual bool is_single_thread() const = 0;
		virtual bool has_peer(aux::peer_connection const* p) const = 0;
		virtual bool any_torrent_has_peer(aux::peer_connection const* p) const = 0;
		virtual bool is_posting_torrent_updates() const = 0;
#endif
	protected:
		~session_logger() {}
	}